

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O1

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,FunctionResultCallNode *node)

{
  ExpressionNode *pEVar1;
  undefined8 *puVar2;
  int iVar3;
  optional<TypeName> *poVar4;
  undefined4 extraout_var;
  mapped_type *__rhs;
  long *plVar5;
  size_type *psVar6;
  TypeChecker typeChecker;
  string local_70;
  TypeChecker local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pEVar1 = (node->call_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,this);
  local_50.symbols_ = &this->symbols_;
  local_50.super_Visitor._vptr_Visitor = (_func_int **)&PTR__Visitor_001f4478;
  local_50.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
  super__Optional_payload_base<TypeName>._M_engaged = false;
  pEVar1 = (node->call_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,&local_50);
  poVar4 = TypeChecker::getType(&local_50);
  if (((poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
       super__Optional_payload_base<TypeName>._M_engaged == true) &&
     ((poVar4 = TypeChecker::getType(&local_50),
      (poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
      super__Optional_payload_base<TypeName>._M_engaged != true ||
      ((poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
       super__Optional_payload_base<TypeName>._M_payload._M_value != Function)))) {
    poVar4 = TypeChecker::getType(&local_50);
    if ((poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
        super__Optional_payload_base<TypeName>._M_engaged != false) {
      __rhs = std::__detail::
              _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&TypeNameStrings_abi_cxx11_,(key_type *)poVar4);
      std::operator+(&local_38,"Cannot call result of function returning ",__rhs);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_38);
      local_70._M_dataplus._M_p = (pointer)*plVar5;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_70._M_dataplus._M_p == psVar6) {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70.field_2._8_8_ = plVar5[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar6;
      }
      local_70._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      reportError(&local_70,(Node *)node);
    }
    std::__throw_bad_optional_access();
  }
  iVar3 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
  for (puVar2 = *(undefined8 **)CONCAT44(extraout_var,iVar3);
      puVar2 != (undefined8 *)CONCAT44(extraout_var,iVar3); puVar2 = (undefined8 *)*puVar2) {
    (**(code **)(*(long *)puVar2[2] + 0x10))((long *)puVar2[2],this);
  }
  return;
}

Assistant:

void SemanticAnalyser::visit(const FunctionResultCallNode& node) 
{
  node.getCall().accept(*this);

  TypeChecker typeChecker{symbols_};
  node.getCall().accept(typeChecker);
  if(typeChecker.getType().has_value() && typeChecker.getType() != TypeName::Function)
    reportError("Cannot call result of function returning " + 
      TypeNameStrings.at(typeChecker.getType().value()) + "!", node);
  
  for(const auto& arg : node.getArguments())
    arg->accept(*this);
}